

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStepInnerStepper_FreeVecs(MRIStepInnerStepper stepper)

{
  long in_RDI;
  sunindextype unaff_retaddr;
  int in_stack_00000014;
  long *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == 0) {
    iVar1 = -0x16;
  }
  else {
    arkFreeVecArray(in_stack_00000014,(N_Vector **)stepper,unaff_retaddr,
                    (long *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    (sunindextype)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffe8);
    if (*(long *)(in_RDI + 0x40) != 0) {
      free(*(void **)(in_RDI + 0x40));
      *(undefined8 *)(in_RDI + 0x40) = 0;
    }
    if (*(long *)(in_RDI + 0x38) != 0) {
      free(*(void **)(in_RDI + 0x38));
      *(undefined8 *)(in_RDI + 0x38) = 0;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mriStepInnerStepper_FreeVecs(MRIStepInnerStepper stepper)
{
  if (stepper == NULL) return ARK_ILL_INPUT;

  arkFreeVecArray(stepper->nforcing, &(stepper->forcing),
                  stepper->lrw1, &(stepper->lrw),
                  stepper->liw1, &(stepper->liw));

  if (stepper->vecs != NULL) {
    free(stepper->vecs);
    stepper->vecs = NULL;
  }

  if (stepper->vals != NULL) {
    free(stepper->vals);
    stepper->vals = NULL;
  }

  return(ARK_SUCCESS);
}